

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void sync_read(AV1LfSync *lf_sync,int r,int c,int plane)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  pthread_mutex_t *mutex;
  int nsync;
  
  iVar1 = *(int *)(in_RDI + 0x48);
  if ((in_ESI != 0) && ((in_EDX & iVar1 - 1U) == 0)) {
    __mutex = (pthread_mutex_t *)(*(long *)(in_RDI + (long)in_ECX * 8) + (long)(in_ESI + -1) * 0x28)
    ;
    pthread_mutex_lock(__mutex);
    while (*(int *)(*(long *)(in_RDI + 0x30 + (long)in_ECX * 8) + (long)(in_ESI + -1) * 4) - iVar1 <
           (int)in_EDX) {
      pthread_cond_wait((pthread_cond_t *)
                        (*(long *)(in_RDI + 0x18 + (long)in_ECX * 8) + (long)(in_ESI + -1) * 0x30),
                        __mutex);
    }
    pthread_mutex_unlock(__mutex);
  }
  return;
}

Assistant:

static inline void sync_read(AV1LfSync *const lf_sync, int r, int c,
                             int plane) {
#if CONFIG_MULTITHREAD
  const int nsync = lf_sync->sync_range;

  if (r && !(c & (nsync - 1))) {
    pthread_mutex_t *const mutex = &lf_sync->mutex_[plane][r - 1];
    pthread_mutex_lock(mutex);

    while (c > lf_sync->cur_sb_col[plane][r - 1] - nsync) {
      pthread_cond_wait(&lf_sync->cond_[plane][r - 1], mutex);
    }
    pthread_mutex_unlock(mutex);
  }
#else
  (void)lf_sync;
  (void)r;
  (void)c;
  (void)plane;
#endif  // CONFIG_MULTITHREAD
}